

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::Binding::Bind
          (BindResult *__return_storage_ptr__,Binding *this,ColumnRefExpression *colref,idx_t depth)

{
  size_type __n;
  string *psVar1;
  iterator iVar2;
  reference other;
  pointer *__ptr;
  ColumnBinding binding;
  LogicalType sql_type;
  Expression *local_108;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_100;
  ColumnBinding local_f8;
  idx_t local_e0;
  LogicalType local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [128];
  
  local_e0 = depth;
  psVar1 = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->name_map)._M_h,psVar1);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    psVar1 = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
    (*this->_vptr_Binding[2])((ErrorData *)local_a0,this,psVar1);
    BindResult::BindResult(__return_storage_ptr__,(ErrorData *)local_a0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_a0 + 0x48));
    if ((undefined1 *)local_a0._40_8_ != local_a0 + 0x38) {
      operator_delete((void *)local_a0._40_8_);
    }
    if ((undefined1 *)local_a0._8_8_ != local_a0 + 0x18) {
      operator_delete((void *)local_a0._8_8_);
    }
  }
  else {
    __n = *(size_type *)
           ((long)iVar2.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                  ._M_cur + 0x28);
    local_f8.table_index = this->index;
    local_f8.column_index = __n;
    other = vector<duckdb::LogicalType,_true>::operator[](&this->types,__n);
    LogicalType::LogicalType(&local_d8,other);
    if ((colref->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator[](&this->names,__n);
      ::std::__cxx11::string::_M_assign
                ((string *)&(colref->super_ParsedExpression).super_BaseExpression.alias);
    }
    (*(colref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_c0,colref);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&,unsigned_long&>
              ((duckdb *)&local_108,&local_c0,&local_d8,&local_f8,&local_e0);
    local_100._M_head_impl = local_108;
    local_108 = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_100);
    if (local_100._M_head_impl != (Expression *)0x0) {
      (*((local_100._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_100._M_head_impl = (Expression *)0x0;
    if (local_108 != (Expression *)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
    local_108 = (Expression *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    LogicalType::~LogicalType(&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult Binding::Bind(ColumnRefExpression &colref, idx_t depth) {
	column_t column_index;
	bool success = false;
	success = TryGetBindingIndex(colref.GetColumnName(), column_index);
	if (!success) {
		return BindResult(ColumnNotFoundError(colref.GetColumnName()));
	}
	ColumnBinding binding;
	binding.table_index = index;
	binding.column_index = column_index;
	LogicalType sql_type = types[column_index];
	if (colref.GetAlias().empty()) {
		colref.SetAlias(names[column_index]);
	}
	return BindResult(make_uniq<BoundColumnRefExpression>(colref.GetName(), sql_type, binding, depth));
}